

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O2

int Cec_ManSimulationOne(Gia_Man_t *pAig,Cec_ParSim_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Cec_ManSim_t *p;
  abctime aVar3;
  abctime time;
  char *pStr;
  int level;
  Cec_ManSim_t *pCVar4;
  
  aVar2 = Abc_Clock();
  pStr = (char *)pPars;
  p = Cec_ManSimStart(pAig,pPars);
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    pStr = (char *)0xffffffffffffffff;
    pCVar4 = p;
    iVar1 = Cec_ManSimClassesPrepare(p,-1);
    level = (int)pCVar4;
    if (iVar1 == 0) goto LAB_004d17d9;
  }
  else {
LAB_004d17d9:
    pCVar4 = p;
    iVar1 = Cec_ManSimClassesRefine(p);
    level = (int)pCVar4;
    if (iVar1 == 0) {
      iVar1 = 0;
      goto LAB_004d1812;
    }
  }
  pStr = "The number of failed outputs of the miter = %6d. (Words = %4d. Frames = %4d.)\n";
  Abc_Print(level,"The number of failed outputs of the miter = %6d. (Words = %4d. Frames = %4d.)\n",
            (ulong)(uint)p->nOuts,(ulong)(uint)pPars->nWords,(ulong)(uint)pPars->nFrames);
LAB_004d1812:
  if (pPars->fVerbose != 0) {
    aVar3 = Abc_Clock();
    Abc_PrintTime((int)aVar3 - (int)aVar2,pStr,time);
  }
  Cec_ManSimStop(p);
  return iVar1;
}

Assistant:

int Cec_ManSimulationOne( Gia_Man_t * pAig, Cec_ParSim_t * pPars )
{
    Cec_ManSim_t * pSim;
    int RetValue = 0;
    abctime clkTotal = Abc_Clock();
    pSim = Cec_ManSimStart( pAig, pPars );
    if ( (pAig->pReprs == NULL && (RetValue = Cec_ManSimClassesPrepare( pSim, -1 ))) ||
         (RetValue == 0 &&        (RetValue = Cec_ManSimClassesRefine( pSim ))) )
        Abc_Print( 1, "The number of failed outputs of the miter = %6d. (Words = %4d. Frames = %4d.)\n", 
            pSim->nOuts, pPars->nWords, pPars->nFrames );
    if ( pPars->fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    Cec_ManSimStop( pSim );
    return RetValue;
}